

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferWriteTests.cpp
# Opt level: O0

vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *
deqp::gles2::Functional::addRangeToList
          (vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
           *__return_storage_ptr__,
          vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *oldList,
          IVec2 *newRange)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer pVVar6;
  reference pVVar7;
  bool local_95;
  __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
  local_68;
  int local_60 [2];
  __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
  local_58;
  Vector<int,_2> local_4c;
  IVec2 curRange;
  __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
  local_38;
  __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
  local_30;
  const_iterator oldListIter;
  IVec2 *newRange_local;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *oldList_local;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *newList;
  
  oldListIter._M_current._7_1_ = 0;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::vector
            (__return_storage_ptr__);
  local_30._M_current =
       (Vector<int,_2> *)
       std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::begin(oldList);
  while( true ) {
    local_38._M_current =
         (Vector<int,_2> *)
         std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::end(oldList);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
    bVar2 = false;
    if (bVar1) {
      pVVar6 = __gnu_cxx::
               __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
               ::operator->(&local_30);
      iVar3 = tcu::Vector<int,_2>::x(pVVar6);
      pVVar6 = __gnu_cxx::
               __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
               ::operator->(&local_30);
      iVar4 = tcu::Vector<int,_2>::y(pVVar6);
      iVar5 = tcu::Vector<int,_2>::x(newRange);
      bVar2 = iVar3 + iVar4 < iVar5;
    }
    if (!bVar2) break;
    pVVar7 = __gnu_cxx::
             __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
             ::operator*(&local_30);
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
              (__return_storage_ptr__,pVVar7);
    __gnu_cxx::
    __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
    ::operator++(&local_30);
  }
  tcu::Vector<int,_2>::Vector(&local_4c,newRange);
  while( true ) {
    local_58._M_current =
         (Vector<int,_2> *)
         std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::end(oldList);
    bVar2 = __gnu_cxx::operator!=(&local_30,&local_58);
    local_95 = false;
    if (bVar2) {
      pVVar7 = __gnu_cxx::
               __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
               ::operator*(&local_30);
      local_95 = rangesIntersect(&local_4c,pVVar7);
    }
    if (local_95 == false) break;
    pVVar7 = __gnu_cxx::
             __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
             ::operator*(&local_30);
    unionRanges((Functional *)local_60,&local_4c,pVVar7);
    local_4c.m_data[0] = local_60[0];
    local_4c.m_data[1] = local_60[1];
    __gnu_cxx::
    __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
    ::operator++(&local_30);
  }
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            (__return_storage_ptr__,&local_4c);
  while( true ) {
    local_68._M_current =
         (Vector<int,_2> *)
         std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::end(oldList);
    bVar2 = __gnu_cxx::operator!=(&local_30,&local_68);
    if (!bVar2) break;
    pVVar7 = __gnu_cxx::
             __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
             ::operator*(&local_30);
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
              (__return_storage_ptr__,pVVar7);
    __gnu_cxx::
    __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
    ::operator++(&local_30,0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<tcu::IVec2> addRangeToList (const std::vector<tcu::IVec2>& oldList, const tcu::IVec2& newRange)
{
	DE_ASSERT(newRange.y() > 0);

	std::vector<tcu::IVec2>					newList;
	std::vector<tcu::IVec2>::const_iterator	oldListIter	= oldList.begin();

	// Append ranges that end before the new range.
	for (; oldListIter != oldList.end() && oldListIter->x()+oldListIter->y() < newRange.x(); ++oldListIter)
		newList.push_back(*oldListIter);

	// Join any ranges that intersect new range
	{
		tcu::IVec2 curRange = newRange;
		while (oldListIter != oldList.end() && rangesIntersect(curRange, *oldListIter))
		{
			curRange = unionRanges(curRange, *oldListIter);
			++oldListIter;
		}

		newList.push_back(curRange);
	}

	// Append remaining ranges.
	for (; oldListIter != oldList.end(); oldListIter++)
		newList.push_back(*oldListIter);

	DE_ASSERT(isRangeListValid(newList.begin(), newList.end()));

	return newList;
}